

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int gen_nested_loop_label_p(gen_ctx_t gen_ctx,MIR_insn_t insn)

{
  loop_node_t plVar1;
  bb_t_conflict pbVar2;
  loop_node_t_conflict parent;
  loop_node_t_conflict node;
  bb_t_conflict bb;
  MIR_insn_t insn_local;
  gen_ctx_t gen_ctx_local;
  
  if ((int)*(undefined8 *)&insn->field_0x18 != 0xb4) {
    __assert_fail("insn->code == MIR_LABEL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x2db,"int gen_nested_loop_label_p(gen_ctx_t, MIR_insn_t)");
  }
  if (gen_ctx->optimize_level < 2) {
    gen_ctx_local._4_4_ = 0;
  }
  else {
    pbVar2 = get_insn_bb(gen_ctx,insn);
    if (pbVar2->loop_node == (loop_node_t_conflict)0x0) {
      gen_ctx_local._4_4_ = 0;
    }
    else {
      plVar1 = pbVar2->loop_node->parent;
      if ((plVar1->entry == (loop_node_t)0x0) || (plVar1->entry->bb != pbVar2)) {
        gen_ctx_local._4_4_ = 0;
      }
      else {
        for (parent = DLIST_loop_node_t_head(&plVar1->children); parent != (loop_node_t_conflict)0x0
            ; parent = DLIST_loop_node_t_next(parent)) {
          if (parent->bb == (bb_t)0x0) {
            return 0;
          }
        }
        gen_ctx_local._4_4_ = 1;
      }
    }
  }
  return gen_ctx_local._4_4_;
}

Assistant:

static int MIR_UNUSED gen_nested_loop_label_p (gen_ctx_t gen_ctx, MIR_insn_t insn) {
  gen_assert (insn->code == MIR_LABEL);
  if (optimize_level <= 1) return FALSE;
  bb_t bb = get_insn_bb (gen_ctx, insn);
  if (bb->loop_node == NULL) return FALSE;
  loop_node_t node, parent = bb->loop_node->parent;
  if (parent->entry == NULL || parent->entry->bb != bb) return FALSE;
  for (node = DLIST_HEAD (loop_node_t, parent->children); node != NULL;
       node = DLIST_NEXT (loop_node_t, node))
    if (node->bb == NULL) return FALSE; /* subloop */
  return TRUE;
}